

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<unsigned_long,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>&,std::__cxx11::string_const&,0ul,1ul>
               (undefined8 param_1,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_2)

{
  bad_boxed_cast *anon_var_0;
  Type_Conversions_State *in_stack_000000c0;
  Boxed_Value *in_stack_000000c8;
  
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_2,0);
  boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>&>
            (in_stack_000000c8,in_stack_000000c0);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_2,1);
  boxed_cast<std::__cxx11::string_const&>(in_stack_000000c8,in_stack_000000c0);
  return true;
}

Assistant:

bool compare_types_cast(Indexes<I...>, Ret (*)(Params...),
             const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          try {
            (void)params; (void)t_conversions;
            (void)std::initializer_list<int>{(boxed_cast<Params>(params[I], &t_conversions), 0)...};
            return true;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }

        }